

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void clear_all_line_same(Am_Object *scroll_menu)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_38;
  Am_Object sel;
  undefined1 local_20 [8];
  Am_Value_List sel_list;
  Am_Object *scroll_menu_local;
  
  sel_list.item = (Am_List_Item *)scroll_menu;
  pAVar2 = Am_Object::Get(scroll_menu,0x171,3);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20,pAVar2);
  bVar1 = Am_Value_List::Valid((Am_Value_List *)local_20);
  if (bVar1) {
    Am_Object::Am_Object(&local_38);
    Am_Value_List::Start((Am_Value_List *)local_20);
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_20), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar2 = Am_Value_List::Get((Am_Value_List *)local_20);
      Am_Object::operator=(&local_38,pAVar2);
      set_text_leaf_parts(&local_38,&Am_No_Style);
      Am_Value_List::Next((Am_Value_List *)local_20);
    }
    Am_Object::~Am_Object(&local_38);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
  return;
}

Assistant:

void
clear_all_line_same(Am_Object &scroll_menu)
{
  Am_Value_List sel_list =
      scroll_menu.Get(Am_SAVED_OLD_OBJECT_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (sel_list.Valid()) {
    Am_Object sel;
    for (sel_list.Start(); !sel_list.Last(); sel_list.Next()) {
      sel = sel_list.Get();
      set_text_leaf_parts(sel, Am_No_Style);
    }
  }
}